

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O1

long oggpack_look(oggpack_buffer *b,int bits)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte *pbVar6;
  ulong uVar7;
  int iVar8;
  ogg_reference *poVar9;
  int iVar10;
  ulong uVar11;
  
  iVar1 = b->headbit;
  iVar8 = bits + iVar1;
  uVar11 = b->headend;
  bVar5 = (byte)iVar1;
  if (uVar11 * 8 - (long)iVar8 != 0 && (long)iVar8 <= (long)(uVar11 * 8)) {
    pbVar6 = b->headptr;
    uVar7 = (ulong)(*pbVar6 >> (bVar5 & 0x1f));
    if ((((8 < iVar8) &&
         (uVar7 = (long)(int)((uint)pbVar6[1] << (8 - bVar5 & 0x1f)) | uVar7, 0x10 < iVar8)) &&
        (uVar7 = uVar7 | (long)(int)((uint)pbVar6[2] << (0x10 - bVar5 & 0x1f)), 0x18 < iVar8)) &&
       (uVar7 = uVar7 | (long)(int)((uint)pbVar6[3] << (0x18 - bVar5 & 0x1f)),
       iVar1 != 0 && 0x20 < iVar8)) {
      uVar7 = uVar7 | (long)(int)((uint)pbVar6[4] << (-bVar5 & 0x1f));
    }
    goto LAB_00132cf8;
  }
  if ((int)uVar11 < 0) {
LAB_00132ce9:
    bVar4 = false;
  }
  else {
    bVar3 = true;
    bVar4 = true;
    if (iVar8 != 0) {
      poVar9 = b->head;
      if ((int)uVar11 == 0) {
        do {
          poVar9 = poVar9->next;
          if (poVar9 == (ogg_reference *)0x0) goto LAB_00132ce9;
          uVar2 = (uint)poVar9->length;
          uVar11 = (ulong)uVar2;
        } while (uVar2 == 0);
        pbVar6 = poVar9->buffer->data + poVar9->begin;
      }
      else {
        pbVar6 = b->headptr;
      }
      uVar7 = (ulong)(*pbVar6 >> (bVar5 & 0x1f));
      if (8 < iVar8) {
        iVar10 = (int)uVar11 + -1;
        if (iVar10 == 0) {
          do {
            poVar9 = poVar9->next;
            if (poVar9 == (ogg_reference *)0x0) {
              bVar3 = false;
              goto LAB_00132cf3;
            }
            iVar10 = (int)poVar9->length;
          } while (iVar10 == 0);
          pbVar6 = poVar9->buffer->data + poVar9->begin;
        }
        else {
          pbVar6 = pbVar6 + 1;
        }
        uVar7 = (long)(int)((uint)*pbVar6 << (8 - bVar5 & 0x1f)) | uVar7;
        if (0x10 < iVar8) {
          iVar10 = iVar10 + -1;
          if (iVar10 == 0) {
            do {
              poVar9 = poVar9->next;
              if (poVar9 == (ogg_reference *)0x0) goto LAB_00132dbd;
              iVar10 = (int)poVar9->length;
            } while (iVar10 == 0);
            pbVar6 = poVar9->buffer->data + poVar9->begin;
          }
          else {
            pbVar6 = pbVar6 + 1;
          }
          uVar7 = uVar7 | (long)(int)((uint)*pbVar6 << (0x10 - bVar5 & 0x1f));
          if (0x18 < iVar8) {
            iVar10 = iVar10 + -1;
            if (iVar10 == 0) {
              do {
                poVar9 = poVar9->next;
                if (poVar9 == (ogg_reference *)0x0) goto LAB_00132dbd;
                iVar10 = (int)poVar9->length;
              } while (iVar10 == 0);
              pbVar6 = poVar9->buffer->data + poVar9->begin;
            }
            else {
              pbVar6 = pbVar6 + 1;
            }
            uVar7 = uVar7 | (long)(int)((uint)*pbVar6 << (0x18 - bVar5 & 0x1f));
            if (iVar1 != 0 && 0x20 < iVar8) {
              if (iVar10 == 1) {
                do {
                  poVar9 = poVar9->next;
                  if (poVar9 == (ogg_reference *)0x0) goto LAB_00132dbd;
                } while ((int)poVar9->length == 0);
                pbVar6 = poVar9->buffer->data + poVar9->begin;
              }
              else {
                pbVar6 = pbVar6 + 1;
              }
              uVar7 = uVar7 | (long)(int)((uint)*pbVar6 << (-bVar5 & 0x1f));
            }
          }
        }
      }
      goto LAB_00132cf3;
    }
  }
  bVar3 = bVar4;
  uVar7 = 0xffffffffffffffff;
  goto LAB_00132cf3;
LAB_00132dbd:
  bVar3 = false;
LAB_00132cf3:
  if (!bVar3) {
    return -1;
  }
LAB_00132cf8:
  return uVar7 & mask[bits];
}

Assistant:

long oggpack_look(oggpack_buffer *b,int bits){
  unsigned long m=mask[bits];
  unsigned long ret=-1;

  bits+=b->headbit;

  if(bits >= b->headend<<3){
    int            end=b->headend;
    unsigned char *ptr=b->headptr;
    ogg_reference *head=b->head;

    if(end<0)return -1;
    
    if(bits){
      _lookspan();
      ret=*ptr++>>b->headbit;
      if(bits>8){
        --end;
        _lookspan();
        ret|=*ptr++<<(8-b->headbit);  
        if(bits>16){
          --end;
          _lookspan();
          ret|=*ptr++<<(16-b->headbit);  
          if(bits>24){
            --end;
            _lookspan();
            ret|=*ptr++<<(24-b->headbit);  
            if(bits>32 && b->headbit){
              --end;
              _lookspan();
              ret|=*ptr<<(32-b->headbit);
            }
          }
        }
      }
    }

  }else{

    /* make this a switch jump-table */
    ret=b->headptr[0]>>b->headbit;
    if(bits>8){
      ret|=b->headptr[1]<<(8-b->headbit);  
      if(bits>16){
        ret|=b->headptr[2]<<(16-b->headbit);  
        if(bits>24){
          ret|=b->headptr[3]<<(24-b->headbit);  
          if(bits>32 && b->headbit)
            ret|=b->headptr[4]<<(32-b->headbit);
        }
      }
    }
  }

  ret&=m;
  return ret;
}